

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O1

int duckdb::History::Load(char *filename)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  size_t len;
  char *buf;
  string result;
  LineReader reader;
  char *pcStack_960a8;
  idx_t iStack_960a0;
  char acStack_96098 [16];
  undefined1 *puStack_96088;
  undefined8 uStack_96080;
  undefined1 auStack_96078 [16];
  LineReader LStack_96068;
  
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    iVar2 = -1;
  }
  else {
    pcStack_960a8 = acStack_96098;
    iStack_960a0 = 0;
    acStack_96098[0] = '\0';
    while( true ) {
      bVar1 = LineReader::NextLine(&LStack_96068);
      if (!bVar1) break;
      if ((iStack_960a0 == 0) && (LStack_96068.line_buffer[0] == '.')) {
        len = strlen(LStack_96068.line_buffer);
        Add(LStack_96068.line_buffer,len);
      }
      else {
        ::std::__cxx11::string::append((char *)&pcStack_960a8);
        iVar2 = duckdb_shell_sqlite3_complete(pcStack_960a8);
        if (iVar2 == 0) {
          ::std::__cxx11::string::append((char *)&pcStack_960a8);
        }
        else {
          Add(pcStack_960a8,iStack_960a0);
          uStack_96080 = 0;
          auStack_96078[0] = 0;
          puStack_96088 = auStack_96078;
          ::std::__cxx11::string::operator=((string *)&pcStack_960a8,(string *)&puStack_96088);
          if (puStack_96088 != auStack_96078) {
            operator_delete(puStack_96088);
          }
        }
      }
    }
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    history_file = strdup(filename);
    if (pcStack_960a8 != acStack_96098) {
      operator_delete(pcStack_960a8);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int History::Load(const char *filename) {
	LineReader reader;
	if (!reader.Init(filename)) {
		return -1;
	}

	std::string result;
	while (reader.NextLine()) {
		auto buf = reader.GetLine();
		if (result.empty() && buf[0] == '.') {
			// if the first character is a dot this is a dot command
			// add the full line to the history
			History::Add(buf);
			continue;
		}
		// else we are parsing a SQL statement
		result += buf;
		if (sqlite3_complete(result.c_str())) {
			// this line contains a full SQL statement - add it to the history
			History::Add(result.c_str(), result.size());
			result = std::string();
			continue;
		}
		// the result does not contain a full SQL statement - add a newline deliminator and move on to the next line
		result += "\r\n";
	}
	reader.Close();

	history_file = strdup(filename);
	return 0;
}